

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsound_mame.c
# Opt level: O0

void qsound_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  char cVar1;
  uint *puVar2;
  qsound_channel *pC;
  uint uStack_30;
  INT8 sample;
  UINT32 offset;
  UINT32 j;
  UINT32 i;
  qsound_state *chip;
  DEV_SMPL **outputs_local;
  UINT32 samples_local;
  void *param_local;
  
  memset(*outputs,0,(ulong)samples << 2);
  memset(outputs[1],0,(ulong)samples << 2);
  if (*(int *)((long)param + 0x250) != 0) {
    for (uStack_30 = 0; uStack_30 < 0x10; uStack_30 = uStack_30 + 1) {
      puVar2 = (uint *)((long)param + (ulong)uStack_30 * 0x24 + 8);
      if ((*(char *)((long)puVar2 + 0x12) != '\0') && ((char)puVar2[8] == '\0')) {
        for (offset = 0; offset < samples; offset = offset + 1) {
          puVar2[1] = (puVar2[7] >> 0xc) + puVar2[1];
          puVar2[7] = puVar2[7] & 0xfff;
          puVar2[7] = puVar2[3] + puVar2[7];
          if ((uint)*(ushort *)((long)puVar2 + 10) <= puVar2[1]) {
            if ((short)puVar2[2] == 0) {
              puVar2[1] = puVar2[1] - 1;
              puVar2[7] = puVar2[7] + 0x1000;
              break;
            }
            puVar2[1] = puVar2[1] - (uint)(ushort)puVar2[2];
            if ((uint)*(ushort *)((long)puVar2 + 10) <= puVar2[1]) {
              puVar2[1] = (uint)*(ushort *)((long)puVar2 + 10) - (uint)(ushort)puVar2[2];
            }
            puVar2[1] = puVar2[1] & 0xffff;
          }
          cVar1 = *(char *)(*(long *)((long)param + 0x248) +
                           (ulong)((*puVar2 | puVar2[1]) & *(uint *)((long)param + 0x254)));
          (*outputs)[offset] =
               ((int)((int)cVar1 * puVar2[5] * (uint)(ushort)puVar2[4]) >> 0xe) + (*outputs)[offset]
          ;
          outputs[1][offset] =
               ((int)((int)cVar1 * puVar2[6] * (uint)(ushort)puVar2[4]) >> 0xe) + outputs[1][offset]
          ;
        }
      }
    }
  }
  return;
}

Assistant:

static void qsound_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	qsound_state *chip = (qsound_state *)param;
	UINT32 i,j;
	UINT32 offset;
	INT8 sample;
	qsound_channel *pC;

	// Clear the buffers
	memset(outputs[0], 0, samples * sizeof(*outputs[0]));
	memset(outputs[1], 0, samples * sizeof(*outputs[1]));
	if (! chip->sample_rom_length)
		return;

	for (j = 0; j < QSOUND_CHANNELS; j++)
	{
		pC=&chip->channel[j];
		if (pC->enabled && ! pC->Muted)
		{
			// Go through the buffer and add voice contributions
			for (i = 0; i < samples; i++)
			{
				pC->address += (pC->step_ptr >> 12);
				pC->step_ptr &= 0xfff;
				pC->step_ptr += pC->freq;

				if (pC->address >= pC->end)
				{
					if (pC->loop)
					{
						// Reached the end, restart the loop
						pC->address -= pC->loop;

						// Make sure we don't overflow (what does the real chip do in this case?)
						if (pC->address >= pC->end)
							pC->address = pC->end - pC->loop;

						pC->address &= 0xffff;
					}
					else
					{
						// Reached the end of a non-looped sample
						//pC->enabled = 0;
						pC->address --;	// ensure that old ripped VGMs still work
						pC->step_ptr += 0x1000;
						break;
					}
				}
				
				offset = pC->bank | pC->address;
				sample = chip->sample_rom[offset & chip->sample_rom_mask];
				outputs[0][i] += ((sample * pC->lvol * pC->vol) >> 14);
				outputs[1][i] += ((sample * pC->rvol * pC->vol) >> 14);
			}
		}
	}
}